

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

void __thiscall H264StreamReader::onShiftBuffer(H264StreamReader *this,int offset)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  
  MPEGStreamReader::onShiftBuffer(&this->super_MPEGStreamReader,offset);
  puVar1 = (this->super_MPEGStreamReader).m_lastDecodedPos;
  if ((puVar1 == (uint8_t *)0x0) || (this->m_priorityNalAddr < puVar1)) {
    this->m_priorityNalAddr = (uint8_t *)0x0;
  }
  else {
    this->m_priorityNalAddr = this->m_priorityNalAddr + -(long)offset;
  }
  puVar2 = (uint8_t *)0x0;
  if (puVar1 < this->m_OffsetMetadataPtsAddr) {
    puVar2 = this->m_OffsetMetadataPtsAddr + -(long)offset;
  }
  this->m_OffsetMetadataPtsAddr = puVar2;
  return;
}

Assistant:

void H264StreamReader::onShiftBuffer(const int offset)
{
    MPEGStreamReader::onShiftBuffer(offset);
    if (m_lastDecodedPos && m_priorityNalAddr >= m_lastDecodedPos)
        m_priorityNalAddr -= offset;
    else
        m_priorityNalAddr = nullptr;
    if (m_OffsetMetadataPtsAddr > m_lastDecodedPos)
        m_OffsetMetadataPtsAddr -= offset;
    else
        m_OffsetMetadataPtsAddr = nullptr;
}